

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SqlExec(int *pRC,Fts3Table *p,int eStmt,sqlite3_value **apVal)

{
  sqlite3_stmt *in_RSI;
  sqlite3_value **in_RDI;
  long in_FS_OFFSET;
  int rc;
  Fts3Table *unaff_retaddr;
  sqlite3_stmt *pStmt;
  int local_34;
  sqlite3_stmt *pStmt_00;
  
  pStmt_00 = *(sqlite3_stmt **)(in_FS_OFFSET + 0x28);
  if (*(int *)in_RDI == 0) {
    local_34 = fts3SqlStmt(unaff_retaddr,(int)((ulong)pStmt_00 >> 0x20),
                           (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa,in_RDI);
    if (local_34 == 0) {
      sqlite3_step(pStmt_00);
      local_34 = sqlite3_reset(in_RSI);
    }
    *(int *)in_RDI = local_34;
  }
  if (*(sqlite3_stmt **)(in_FS_OFFSET + 0x28) != pStmt_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3SqlExec(
  int *pRC,                /* Result code */
  Fts3Table *p,            /* The FTS3 table */
  int eStmt,               /* Index of statement to evaluate */
  sqlite3_value **apVal    /* Parameters to bind */
){
  sqlite3_stmt *pStmt;
  int rc;
  if( *pRC ) return;
  rc = fts3SqlStmt(p, eStmt, &pStmt, apVal);
  if( rc==SQLITE_OK ){
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
  }
  *pRC = rc;
}